

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::AllocateHandle
          (CSimpleHandleManager *this,CPalThread *pThread,IPalObject *pObject,DWORD dwAccessRights,
          bool fInheritable,HANDLE *ph)

{
  IPalObject *pIVar1;
  uint uVar2;
  HANDLE_TABLE_ENTRY *pHVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  PAL_ERROR PVar7;
  
  InternalEnterCriticalSection(pThread,&this->m_csLock);
  uVar6 = this->m_hiFreeListStart;
  if (uVar6 == 0xffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00129ae0:
      abort();
    }
    uVar2 = this->m_dwTableGrowthRate + this->m_dwTableSize;
    PVar7 = 0xe;
    if (0x3ffffffd < uVar2) goto LAB_00129ac3;
    pHVar3 = (HANDLE_TABLE_ENTRY *)InternalRealloc(this->m_rghteHandleTable,(ulong)uVar2 << 4);
    if (pHVar3 == (HANDLE_TABLE_ENTRY *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00129ae0;
      goto LAB_00129ac3;
    }
    this->m_rghteHandleTable = pHVar3;
    uVar5 = (ulong)this->m_dwTableSize;
    lVar4 = uVar5 << 4;
    uVar6 = uVar5;
    while (uVar2 = this->m_dwTableGrowthRate + (int)uVar5, uVar6 < uVar2) {
      uVar6 = uVar6 + 1;
      *(ulong *)((long)&pHVar3->u + lVar4) = uVar6;
      pHVar3 = this->m_rghteHandleTable;
      (&pHVar3->fEntryAllocated)[lVar4] = false;
      lVar4 = lVar4 + 0x10;
      uVar5 = (ulong)this->m_dwTableSize;
    }
    this->m_hiFreeListStart = uVar5;
    this->m_dwTableSize = uVar2;
    pHVar3[uVar2 - 1].u.hiNextIndex = 0xffffffffffffffff;
    uVar6 = (ulong)(uint)this->m_hiFreeListStart;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
  }
  uVar6 = uVar6 & 0xffffffff;
  pIVar1 = this->m_rghteHandleTable[uVar6].u.pObject;
  this->m_hiFreeListStart = (HANDLE_INDEX)pIVar1;
  if (pIVar1 == (IPalObject *)0xffffffffffffffff) {
    this->m_hiFreeListEnd = 0xffffffffffffffff;
  }
  *ph = (HANDLE)(uVar6 * 4 + 4);
  (*pObject->_vptr_IPalObject[7])(pObject);
  this->m_rghteHandleTable[uVar6].u.pObject = pObject;
  pHVar3 = this->m_rghteHandleTable;
  pHVar3[uVar6].dwAccessRights = dwAccessRights;
  pHVar3[uVar6].fInheritable = fInheritable;
  pHVar3[uVar6].fEntryAllocated = true;
  PVar7 = 0;
LAB_00129ac3:
  InternalLeaveCriticalSection(pThread,&this->m_csLock);
  return PVar7;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::AllocateHandle(
    CPalThread *pThread,
    IPalObject *pObject,
    DWORD dwAccessRights,
    bool fInheritable,
    HANDLE *ph
    )
{
    PAL_ERROR palError = NO_ERROR;
    DWORD dwIndex;

    Lock(pThread);

    /* if no free handles are available, we need to grow the handle table and
       add new handles to the pool */
    if (m_hiFreeListStart == c_hiInvalid)
    {
        HANDLE_TABLE_ENTRY* rghteTempTable;

        TRACE("Handle pool empty (%d handles allocated), growing handle table "
              "by %d entries.\n", m_dwTableSize, m_dwTableGrowthRate );

        /* make sure handle values don't overflow */
        if (m_dwTableSize + m_dwTableGrowthRate >= c_MaxIndex)
        {
            WARN("Unable to allocate handle : maximum (%d) reached!\n",
                 m_dwTableSize);
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }

        /* grow handle table */
        rghteTempTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalRealloc(
            m_rghteHandleTable,
            (m_dwTableSize + m_dwTableGrowthRate) * sizeof(HANDLE_TABLE_ENTRY)));
        
        if (NULL == rghteTempTable)
        {
            WARN("not enough memory to grow handle table!\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }
        m_rghteHandleTable = rghteTempTable;

        /* update handle table and handle pool */
        for (DWORD dw = m_dwTableSize; dw < m_dwTableSize + m_dwTableGrowthRate; dw += 1)
        {
            /* new handles are initially invalid */
            /* the last "old" handle was m_dwTableSize-1, so the new
               handles range from m_dwTableSize to
               m_dwTableSize+m_dwTableGrowthRate-1 */
            m_rghteHandleTable[dw].u.hiNextIndex = dw + 1;
            m_rghteHandleTable[dw].fEntryAllocated = FALSE;
        }

        m_hiFreeListStart = m_dwTableSize;
        m_dwTableSize += m_dwTableGrowthRate;
        m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
        m_hiFreeListEnd = m_dwTableSize - 1;
        
    }

    /* take the next free handle */
    dwIndex = m_hiFreeListStart;

    /* remove the handle from the pool */
    m_hiFreeListStart = m_rghteHandleTable[dwIndex].u.hiNextIndex;
    
    /* clear the tail record if this is the last handle slot available */
    if(m_hiFreeListStart == c_hiInvalid) 
    {
        m_hiFreeListEnd = c_hiInvalid;
    }

    /* save the data associated with the new handle */
    *ph = HandleIndexToHandle(dwIndex);
    
    pObject->AddReference();
    m_rghteHandleTable[dwIndex].u.pObject = pObject;
    m_rghteHandleTable[dwIndex].dwAccessRights = dwAccessRights;
    m_rghteHandleTable[dwIndex].fInheritable = fInheritable;
    m_rghteHandleTable[dwIndex].fEntryAllocated = TRUE;

AllocateHandleExit:

    Unlock(pThread);

    return palError;    
}